

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O0

void * memprof_allocf(void *ud,void *ptr,size_t osize,size_t nsize)

{
  int iVar1;
  lj_wbuf *buf;
  size_t in_RCX;
  lua_State *in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *nptr;
  lj_wbuf *out;
  alloc *oalloc;
  memprof *mp;
  uint64_t in_stack_ffffffffffffffb8;
  lj_wbuf *buf_00;
  uint8_t aevent;
  memprof *mp_00;
  
  mp_00 = (memprof *)&memprof.orig_alloc;
  buf_00 = &memprof.out;
  buf = (lj_wbuf *)(*memprof.orig_alloc.allocf)(in_RDI,in_RSI,(size_t)in_RDX,in_RCX);
  aevent = (uint8_t)((ulong)buf_00 >> 0x38);
  if (in_RCX == 0) {
    memprof_write_caller(mp_00,aevent);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
  }
  else if (in_RSI == (void *)0x0) {
    memprof_write_caller(mp_00,aevent);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
  }
  else {
    memprof_write_caller(mp_00,aevent);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
    lj_wbuf_addu64(buf,in_stack_ffffffffffffffb8);
  }
  iVar1 = lj_wbuf_test_flag(buf_00,'\x02');
  if (iVar1 != 0) {
    lj_memprof_stop(in_RDX);
  }
  return buf;
}

Assistant:

static void *memprof_allocf(void *ud, void *ptr, size_t osize, size_t nsize)
{
  struct memprof *mp = &memprof;
  const struct alloc *oalloc = &mp->orig_alloc;
  struct lj_wbuf *out = &mp->out;
  void *nptr;

  lj_assertX(MPS_PROFILE == mp->state, "bad memprof profile state");
  lj_assertX(oalloc->allocf != memprof_allocf,
	     "unexpected memprof old alloc function");
  lj_assertX(oalloc->allocf != NULL,
	     "uninitialized memprof old alloc function");
  lj_assertX(ud == oalloc->state, "bad old memprof profile state");

  nptr = oalloc->allocf(ud, ptr, osize, nsize);

  if (nsize == 0) {
    memprof_write_caller(mp, AEVENT_FREE);
    lj_wbuf_addu64(out, (uintptr_t)ptr);
    lj_wbuf_addu64(out, (uint64_t)osize);
  } else if (ptr == NULL) {
    memprof_write_caller(mp, AEVENT_ALLOC);
    lj_wbuf_addu64(out, (uintptr_t)nptr);
    lj_wbuf_addu64(out, (uint64_t)nsize);
  } else {
    memprof_write_caller(mp, AEVENT_REALLOC);
    lj_wbuf_addu64(out, (uintptr_t)ptr);
    lj_wbuf_addu64(out, (uint64_t)osize);
    lj_wbuf_addu64(out, (uintptr_t)nptr);
    lj_wbuf_addu64(out, (uint64_t)nsize);
  }

  /* Deinstrument memprof if required. */
  if (LJ_UNLIKELY(lj_wbuf_test_flag(out, STREAM_STOP)))
    lj_memprof_stop(mainthread(mp->g));

  return nptr;
}